

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void * event_mm_calloc_(size_t count,size_t size)

{
  undefined1 auVar1 [16];
  int *piVar2;
  void *p_1;
  void *p;
  size_t sz;
  size_t size_local;
  size_t count_local;
  
  if ((count == 0) || (size == 0)) {
    count_local = 0;
  }
  else if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
    count_local = (size_t)calloc(count,size);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    if ((SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < count) ||
       (count_local = (size_t)(*mm_malloc_fn_)(count * size), (void *)count_local == (void *)0x0)) {
      piVar2 = __errno_location();
      *piVar2 = 0xc;
      count_local = 0;
    }
    else {
      memset((void *)count_local,0,count * size);
    }
  }
  return (void *)count_local;
}

Assistant:

void *
event_mm_calloc_(size_t count, size_t size)
{
	if (count == 0 || size == 0)
		return NULL;

	if (mm_malloc_fn_) {
		size_t sz = count * size;
		void *p = NULL;
		if (count > EV_SIZE_MAX / size)
			goto error;
		p = mm_malloc_fn_(sz);
		if (p)
			return memset(p, 0, sz);
	} else {
		void *p = calloc(count, size);
#ifdef _WIN32
		/* Windows calloc doesn't reliably set ENOMEM */
		if (p == NULL)
			goto error;
#endif
		return p;
	}

error:
	errno = ENOMEM;
	return NULL;
}